

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::TiledInputFile::multiPartInitialize(TiledInputFile *this,InputPartData *part)

{
  size_t __n;
  Data *pDVar1;
  int iVar2;
  string *psVar3;
  undefined4 extraout_var;
  ArgExc *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  psVar3 = Header::type_abi_cxx11_(&part->header);
  __n = psVar3->_M_string_length;
  if (__n == DAT_004a51d8) {
    if (__n != 0) {
      iVar2 = bcmp((psVar3->_M_dataplus)._M_p,Imf_2_5::TILEDIMAGE_abi_cxx11_,__n);
      if (iVar2 != 0) goto LAB_001e105b;
    }
    pDVar1 = this->_data;
    pDVar1->_streamData = part->mutex;
    Header::operator=(&pDVar1->header,&part->header);
    pDVar1 = this->_data;
    pDVar1->version = part->version;
    pDVar1->partNumber = part->partNumber;
    iVar2 = (*pDVar1->_streamData->is->_vptr_IStream[2])();
    this->_data->memoryMapped = SUB41(iVar2,0);
    initialize(this);
    pDVar1 = this->_data;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_38,&part->chunkOffsets);
    TileOffsets::readFrom(&pDVar1->tileOffsets,&local_38,&this->_data->fileIsComplete);
    if (local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    iVar2 = (*this->_data->_streamData->is->_vptr_IStream[5])();
    this->_data->_streamData->currentPosition = CONCAT44(extraout_var,iVar2);
    return;
  }
LAB_001e105b:
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,"Can\'t build a TiledInputFile from a type-mismatched part.");
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

void
TiledInputFile::multiPartInitialize(InputPartData* part)
{
    if (part->header.type() != TILEDIMAGE)
        throw IEX_NAMESPACE::ArgExc("Can't build a TiledInputFile from a type-mismatched part.");

    _data->_streamData = part->mutex;
    _data->header = part->header;
    _data->version = part->version;
    _data->partNumber = part->partNumber;
    _data->memoryMapped = _data->_streamData->is->isMemoryMapped();
    initialize();
    _data->tileOffsets.readFrom(part->chunkOffsets,_data->fileIsComplete);
    _data->_streamData->currentPosition = _data->_streamData->is->tellg();
}